

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::
     pnext_chain_pdf2_add_json_value<VkPhysicalDeviceFeatures2,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (Value *base,VkPhysicalDeviceFeatures2 *t,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc)

{
  bool bVar1;
  GenericStringRef<char> local_50;
  uint local_3c;
  undefined1 local_38 [8];
  Value nexts;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc_local;
  VkPhysicalDeviceFeatures2 *t_local;
  Value *base_local;
  
  if (t->pNext != (void *)0x0) {
    nexts.data_.o.members = (Member *)alloc;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_38);
    bVar1 = pnext_chain_pdf2_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      (t->pNext,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)
                                nexts.data_.o.members,(Value *)local_38);
    if (bVar1) {
      rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_50,(char (*) [6])"pNext");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(base,&local_50,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_38,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)nexts.data_.o.members)
      ;
    }
    else {
      base_local._7_1_ = 0;
    }
    local_3c = (uint)!bVar1;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_38);
    if (local_3c != 0) goto LAB_0012e19c;
  }
  base_local._7_1_ = 1;
LAB_0012e19c:
  return (bool)(base_local._7_1_ & 1);
}

Assistant:

static bool pnext_chain_pdf2_add_json_value(Value &base, const T &t, Allocator &alloc)
{
	if (t.pNext)
	{
		Value nexts;
		if (!pnext_chain_pdf2_json_value(t.pNext, alloc, &nexts))
			return false;
		base.AddMember("pNext", nexts, alloc);
	}
	return true;
}